

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryOperator.cpp
# Opt level: O0

void __thiscall
BinaryOperator::BinaryOperator
          (BinaryOperator *this,ptr<Operation> *operation,ptr<Expression> *left,
          ptr<Expression> *right)

{
  ptr<Expression> *right_local;
  ptr<Expression> *left_local;
  ptr<Operation> *operation_local;
  BinaryOperator *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_evaluate_00195b68;
  std::shared_ptr<Expression>::shared_ptr(&this->leftExpression,left);
  std::shared_ptr<Expression>::shared_ptr(&this->rightExpression,right);
  std::shared_ptr<Operation>::shared_ptr(&this->operation,operation);
  return;
}

Assistant:

BinaryOperator::BinaryOperator(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right)
    : operation(std::move(operation)), leftExpression(std::move(left)), rightExpression(std::move(right)) { }